

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

char * path_append(char *buf,char *path,char *add,size_t bufsize)

{
  size_t sVar1;
  size_t sVar2;
  ulong in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t len;
  size_t local_30;
  char *local_8;
  
  sVar1 = strlen(in_RSI);
  sVar2 = strlen(in_RDX);
  if (sVar1 + sVar2 + 1 < in_RCX) {
    if (in_RDI != in_RSI) {
      strcpy(in_RDI,in_RSI);
    }
    local_30 = sVar1;
    if ((sVar1 != 0) && (in_RDI[sVar1 - 1] != '/')) {
      local_30 = sVar1 + 1;
      in_RDI[sVar1] = '/';
    }
    strcpy(in_RDI + local_30,in_RDX);
    local_8 = in_RDI;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *path_append(char *buf,const char *path,const char *add,size_t bufsize)
/* append a file- or path-name to an existing path and convert */
{
  size_t len = strlen(path);
#if defined(AMIGAOS) || defined(_WIN32)
  char *p;
#endif

  if ((len+strlen(add)+1) < bufsize) {
    if (buf != path)
      strcpy(buf,path);

#if defined(AMIGAOS)
    if (len>0 && buf[len-1]!='/' && buf[len-1]!=':')
      buf[len++] = '/';
    strcpy(buf+len,add);
    path = p = buf;
    while (*path) {
      if (*path == '.') {
        if (*(path+1) == '\0') {
          path++;
          continue;
        }
        else if (*(path+1)=='/') {
          path += 2;
          continue;
        }
        else if (*(path+1)=='.' && *(path+2)=='/')
          path += 2;
      }
      *p++ = *path++;
    }
    *p = '\0';

#elif defined(_WIN32)
    if (len>0 && buf[len-1]!='\\' && buf[len-1]!='/' && buf[len-1]!=':')
      buf[len++] = '\\';
    strcpy(buf+len,add);
    for (p=buf; *p; *p++) {
      if (*p == '/')
        *p = '\\';
    }

#else
    if (len>0 && buf[len-1]!='/')
      buf[len++] = '/';
    strcpy(buf+len,add);
#endif

    return buf;
  }

  return NULL;
}